

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarVarSlice::VarVarSlice(VarVarSlice *this,Var *parent,Var *slice)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  size_type sVar7;
  reference pvVar8;
  Var *pVVar9;
  uint64_t uVar10;
  uint32_t *puVar11;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  allocator<const_kratos::IRNode_*> local_1b1;
  Var *local_1b0;
  Var *local_1a8;
  Var **local_1a0;
  size_type local_198;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_190;
  undefined1 local_178 [44];
  uint local_14c;
  bool has_error;
  iterator puStack_148;
  undefined8 local_140;
  allocator<unsigned_int> local_131;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_130;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_128;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  uint local_fc;
  iterator local_f8;
  undefined8 local_f0;
  uint local_d4;
  Var *pVStack_d0;
  uint32_t required_width;
  Var *slice_local;
  Var *parent_local;
  VarVarSlice *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_b0;
  basic_string_view<char> local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *vargs;
  remove_reference_t<unsigned_int> *local_50;
  char (*local_48) [69];
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_10;
  
  pVStack_d0 = slice;
  slice_local = parent;
  parent_local = (Var *)this;
  VarSlice::VarSlice(&this->super_VarSlice,parent,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0059d7f0;
  this->sliced_var_ = pVStack_d0;
  pvVar6 = Var::size(slice_local);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
  if (sVar7 == 1) {
    pvVar6 = Var::size(slice_local);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar6);
    if ((*pvVar8 == 1) && (bVar2 = Var::explicit_array(slice_local), !bVar2)) {
      (this->super_VarSlice).super_Var.var_width_ = 1;
      local_fc = 1;
      local_f8 = &local_fc;
      local_f0 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_f8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(this->super_VarSlice).super_Var.size_,__l_01);
      iVar3 = (*(slice_local->super_IRNode)._vptr_IRNode[7])();
      (this->super_VarSlice).var_high_ = iVar3 - 1;
      (this->super_VarSlice).var_low_ = 0;
      pVVar9 = Var::width_param(slice_local);
      if (pVVar9 == (Var *)0x0) {
        uVar5 = (*(slice_local->super_IRNode)._vptr_IRNode[7])();
        local_d4 = clog2(uVar5);
      }
      else {
        pVVar9 = Var::width_param(slice_local);
        uVar10 = Simulator::static_evaluate_expr(pVVar9);
        local_d4 = (uint)uVar10;
      }
      goto LAB_0020c6d1;
    }
  }
  puVar11 = Var::var_width(slice_local);
  (this->super_VarSlice).super_Var.var_width_ = *puVar11;
  iVar3 = (*(slice_local->super_IRNode)._vptr_IRNode[0x18])();
  (this->super_VarSlice).super_Var.is_packed_ = (bool)((byte)iVar3 & 1);
  pvVar6 = Var::size(slice_local);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
  if (sVar7 < 2) {
    local_14c = 1;
    puStack_148 = &local_14c;
    local_140 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = puStack_148;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(this->super_VarSlice).super_Var.size_,__l_00);
  }
  else {
    pvVar6 = Var::size(slice_local);
    local_128._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
    local_120 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator+(&local_128,1);
    pvVar6 = Var::size(slice_local);
    local_130._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
    std::allocator<unsigned_int>::allocator(&local_131);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,local_120,local_130,
               &local_131);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(this->super_VarSlice).super_Var.size_,&local_118);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_118);
    std::allocator<unsigned_int>::~allocator(&local_131);
  }
  uVar5 = (*(slice_local->super_IRNode)._vptr_IRNode[0x25])();
  (this->super_VarSlice).var_high_ = uVar5;
  uVar5 = (*(slice_local->super_IRNode)._vptr_IRNode[0x26])();
  (this->super_VarSlice).var_low_ = uVar5;
  pVVar9 = Var::get_size_param(slice_local,0);
  if (pVVar9 == (Var *)0x0) {
    pvVar6 = Var::size(slice_local);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar6);
    local_d4 = clog2(*pvVar8);
  }
  else {
    pVVar9 = Var::get_size_param(slice_local,0);
    uVar10 = Simulator::static_evaluate_expr(pVVar9);
    local_d4 = clog2((uint32_t)uVar10);
  }
LAB_0020c6d1:
  uVar1 = local_d4;
  uVar4 = (*(this->sliced_var_->super_IRNode)._vptr_IRNode[7])();
  if (uVar1 < uVar4) {
    local_178[0x2b] = 1;
    bVar2 = IterVar::has_iter_var(this->sliced_var_);
    if ((bVar2) && (bVar2 = IterVar::safe_to_resize(this->sliced_var_,local_d4,false), bVar2)) {
      IterVar::fix_width(&this->sliced_var_,local_d4);
      local_178[0x2b] = 0;
    }
    uVar1 = local_d4;
    if (((local_178[0x2b] & 1) != 0) ||
       (uVar5 = (*(this->sliced_var_->super_IRNode)._vptr_IRNode[7])(), uVar1 != uVar5)) {
      IterVar::safe_to_resize(this->sliced_var_,local_d4,false);
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      pvVar6 = Var::size(slice_local);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar6);
      local_178._4_4_ = *pvVar8 - 1;
      local_178._0_4_ = (*(this->sliced_var_->super_IRNode)._vptr_IRNode[7])();
      local_38 = local_178 + 8;
      local_40 = "Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.";
      local_48 = (char (*) [69])(local_178 + 4);
      local_50 = &local_d4;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
               *)local_178;
      fmt::v7::make_args_checked<unsigned_int,unsigned_int&,unsigned_int,char[69],char>
                (&local_98,
                 (v7 *)"Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.",
                 local_48,local_50,(remove_reference_t<unsigned_int_&> *)vargs,
                 (remove_reference_t<unsigned_int> *)in_R9.values_);
      local_60 = &local_98;
      local_a8 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_60;
      local_20 = local_60;
      local_10 = local_60;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0x222,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_60);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_b0.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_a8.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)(local_178 + 8),(detail *)local_a8.data_,format_str,args);
      local_1b0 = slice_local;
      local_1a8 = pVStack_d0;
      local_1a0 = &local_1b0;
      local_198 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_1b1);
      __l._M_len = local_198;
      __l._M_array = (iterator)local_1a0;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_190,__l,&local_1b1);
      VarException::VarException(this_00,(string *)(local_178 + 8),&local_190);
      __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
    }
  }
  return;
}

Assistant:

VarVarSlice::VarVarSlice(kratos::Var *parent, kratos::Var *slice)
    : VarSlice(parent, 0, 0), sliced_var_(slice) {
    // check the size or width
    // we need to re-compute var_high, var_low, width, and other stuff by ourselves here
    // there is an issue about the var_high and var_low; the problem will only show up during
    // the connectivity check
    // TODO: fix this
    uint32_t required_width;
    if (parent->size().size() == 1 && parent->size().front() == 1 && !parent->explicit_array()) {
        // slice through the 1D array
        // so the width will be 1
        var_width_ = 1;
        size_ = {1};
        // potentially cover all the bits
        var_high_ = parent->width() - 1;
        var_low_ = 0;
        if (parent->width_param())
            required_width = Simulator::static_evaluate_expr(parent->width_param());
        else
            required_width = clog2(parent->width());
    } else {
        var_width_ = parent->var_width();
        is_packed_ = parent->is_packed();
        // peel one layer
        if (parent->size().size() > 1)
            size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
        else
            size_ = {1};
        var_high_ = parent->var_high();
        var_low_ = parent->var_low();
        // we need to compute the clog2 here
        if (parent->get_size_param(0))
            required_width = clog2(Simulator::static_evaluate_expr(parent->get_size_param(0)));
        else
            required_width = clog2(parent->size().front());
    }
    if (required_width < sliced_var_->width()) {
        // may need to demote the variable if it's a var cast
        bool has_error = true;
        if (IterVar::has_iter_var(sliced_var_)) {
            if (IterVar::safe_to_resize(sliced_var_, required_width, false)) {
                IterVar::fix_width(sliced_var_, required_width);
                has_error = false;
            }
        }
        if (has_error || required_width != sliced_var_->width()) {
            // error message copied from verilator
            IterVar::safe_to_resize(sliced_var_, required_width, false);
            throw VarException(
                ::format("Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.",
                         parent->size().front() - 1, required_width, sliced_var_->width()),
                {parent, slice});
        }
    }
}